

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::Runner::makeReporter(Runner *this)

{
  int iVar1;
  IRegistryHub *pIVar2;
  undefined4 extraout_var;
  IStreamingReporter *p;
  ostream *poVar3;
  domain_error *this_00;
  Ptr<Catch::IConfig> local_1d8;
  ostringstream oss;
  allocator local_60 [32];
  string local_40 [8];
  string reporterName;
  
  std::__cxx11::string::string
            ((string *)&local_1d8,(string *)&(((this->m_config).m_p)->m_data).reporterName);
  if (_oss == 0) {
    std::__cxx11::string::string(local_40,"console",local_60);
  }
  else {
    std::__cxx11::string::string(local_40,(string *)&(((this->m_config).m_p)->m_data).reporterName);
  }
  std::__cxx11::string::~string((string *)&local_1d8);
  pIVar2 = getRegistryHub();
  iVar1 = (*pIVar2->_vptr_IRegistryHub[2])(pIVar2);
  local_1d8.m_p = (IConfig *)(this->m_config).m_p;
  if ((Config *)local_1d8.m_p != (Config *)0x0) {
    (*(((Config *)local_1d8.m_p)->super_SharedImpl<Catch::IConfig>).super_IConfig.super_IShared.
      super_NonCopyable._vptr_NonCopyable[2])();
  }
  p = (IStreamingReporter *)
      (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x10))
                ((long *)CONCAT44(extraout_var,iVar1),local_40,&local_1d8);
  Ptr<Catch::IStreamingReporter>::operator=(&this->m_reporter,p);
  Ptr<Catch::IConfig>::~Ptr(&local_1d8);
  if ((this->m_reporter).m_p != (IStreamingReporter *)0x0) {
    std::__cxx11::string::~string(local_40);
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1d8);
  poVar3 = std::operator<<((ostream *)&local_1d8,"No reporter registered with name: \'");
  poVar3 = std::operator<<(poVar3,local_40);
  std::operator<<(poVar3,"\'");
  this_00 = (domain_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::domain_error::domain_error(this_00,(string *)local_60);
  __cxa_throw(this_00,&std::domain_error::typeinfo,std::domain_error::~domain_error);
}

Assistant:

void makeReporter() {
            std::string reporterName = m_config->getReporterName().empty()
                ? "console"
                : m_config->getReporterName();

            m_reporter = getRegistryHub().getReporterRegistry().create( reporterName, m_config.get() );
            if( !m_reporter ) {
                std::ostringstream oss;
                oss << "No reporter registered with name: '" << reporterName << "'";
                throw std::domain_error( oss.str() );
            }
        }